

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_ls.c
# Opt level: O0

int myMonitorFunction(void *cvode_mem,void *user_data)

{
  undefined8 in_RDI;
  sunrealtype unaff_retaddr;
  sunrealtype t;
  UserData data;
  int in_stack_00000088;
  int in_stack_0000008c;
  void *in_stack_00000090;
  undefined8 local_20 [4];
  
  local_20[0] = 0;
  CVodeGetCurrentTime(in_RDI,local_20);
  PrintOutput(data,(N_Vector)t,unaff_retaddr);
  PrintStats(in_stack_00000090,in_stack_0000008c,in_stack_00000088);
  return 0;
}

Assistant:

static int myMonitorFunction(void* cvode_mem, void* user_data)
{
  UserData data = (UserData)user_data;
  sunrealtype t = 0;

  CVodeGetCurrentTime(cvode_mem, &t);
  PrintOutput(cvode_mem, data->u, t);
  PrintStats(cvode_mem, data->linsolver, 0);

  return (0);
}